

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.h
# Opt level: O2

string * __thiscall libsgp4::Tle::ToString_abi_cxx11_(string *__return_storage_ptr__,Tle *this)

{
  ostream *poVar1;
  stringstream ss;
  DateTime local_1c8 [4];
  stringstream local_1a8 [16];
  long local_198;
  undefined8 local_190 [2];
  uint auStack_180 [88];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xffffff4f | 0x80;
  *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 4;
  poVar1 = std::operator<<((ostream *)&local_198,"Norad Number:         ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&local_198,"Int. Designator:      ");
  std::__cxx11::string::string((string *)local_1c8,(string *)&this->int_designator_);
  poVar1 = std::operator<<(poVar1,(string *)local_1c8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_1c8);
  poVar1 = std::operator<<((ostream *)&local_198,"Epoch:                ");
  local_1c8[0].m_encoded = (this->epoch_).m_encoded;
  poVar1 = operator<<(poVar1,local_1c8);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&local_198,"Orbit Number:         ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 8;
  std::operator<<((ostream *)&local_198,"Mean Motion Dt2:      ");
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0xc;
  poVar1 = std::ostream::_M_insert<double>(this->mean_motion_dt2_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&local_198,"Mean Motion Ddt6:     ");
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0xc;
  poVar1 = std::ostream::_M_insert<double>(this->mean_motion_ddt6_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&local_198,"Eccentricity:         ");
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0xc;
  poVar1 = std::ostream::_M_insert<double>(this->eccentricity_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&local_198,"BStar:                ");
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0xc;
  poVar1 = std::ostream::_M_insert<double>(this->bstar_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&local_198,"Inclination:          ");
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0xc;
  poVar1 = std::ostream::_M_insert<double>(this->inclination_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&local_198,"Right Ascending Node: ");
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0xc;
  poVar1 = std::ostream::_M_insert<double>(this->right_ascending_node_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&local_198,"Argument Perigee:     ");
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0xc;
  poVar1 = std::ostream::_M_insert<double>(this->argument_perigee_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&local_198,"Mean Anomaly:         ");
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0xc;
  poVar1 = std::ostream::_M_insert<double>(this->mean_anomaly_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&local_198,"Mean Motion:          ");
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18) + 8) = 0xc;
  poVar1 = std::ostream::_M_insert<double>(this->mean_motion_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;
        ss << std::right << std::fixed;
        ss << "Norad Number:         " << NoradNumber() << std::endl;
        ss << "Int. Designator:      " << IntDesignator() << std::endl;
        ss << "Epoch:                " << Epoch() << std::endl;
        ss << "Orbit Number:         " << OrbitNumber() << std::endl;
        ss << std::setprecision(8);
        ss << "Mean Motion Dt2:      ";
        ss << std::setw(12) << MeanMotionDt2() << std::endl;
        ss << "Mean Motion Ddt6:     ";
        ss << std::setw(12) << MeanMotionDdt6() << std::endl;
        ss << "Eccentricity:         ";
        ss << std::setw(12) << Eccentricity() << std::endl;
        ss << "BStar:                ";
        ss << std::setw(12) << BStar() << std::endl;
        ss << "Inclination:          ";
        ss << std::setw(12) << Inclination(true) << std::endl;
        ss << "Right Ascending Node: ";
        ss << std::setw(12) << RightAscendingNode(true) << std::endl;
        ss << "Argument Perigee:     ";
        ss << std::setw(12) << ArgumentPerigee(true) << std::endl;
        ss << "Mean Anomaly:         ";
        ss << std::setw(12) << MeanAnomaly(true) << std::endl;
        ss << "Mean Motion:          ";
        ss << std::setw(12) << MeanMotion() << std::endl;
        return ss.str();
    }